

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase881::run(TestCase881 *this)

{
  Builder builder_00;
  Reader reader;
  int local_204;
  DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_&,_std::nullptr_t>
  _kjCondition;
  uint local_1cc;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  DebugComparison<int,_unsigned_int> _kjCondition_4;
  Builder local_188;
  Builder root;
  Reader local_138;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField(&orphan,&root);
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &orphan;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x377,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",&_kjCondition);
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::applyReader
            (&local_138,&orphan.builder);
  reader._reader.capTable = local_138._reader.capTable;
  reader._reader.segment = local_138._reader.segment;
  reader._reader.data = local_138._reader.data;
  reader._reader.pointers = local_138._reader.pointers;
  reader._reader.dataSize = local_138._reader.dataSize;
  reader._reader.pointerCount = local_138._reader.pointerCount;
  reader._reader._38_2_ = local_138._reader._38_2_;
  reader._reader.nestingLimit = local_138._reader.nestingLimit;
  reader._reader._44_4_ = local_138._reader._44_4_;
  checkTestMessageAllZero(reader);
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37a,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",&_kjCondition);
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_188,&orphan.builder);
  builder_00._builder.capTable = local_188._builder.capTable;
  builder_00._builder.segment = local_188._builder.segment;
  builder_00._builder.data = local_188._builder.data;
  builder_00._builder.pointers = local_188._builder.pointers;
  builder_00._builder.dataSize = local_188._builder.dataSize;
  builder_00._builder.pointerCount = local_188._builder.pointerCount;
  builder_00._builder._38_2_ = local_188._builder._38_2_;
  checkTestMessageAllZero(builder_00);
  _kjCondition.left =
       (Orphan<capnproto_test::capnp::test::TestAllTypes> *)
       CONCAT71(_kjCondition.left._1_7_,orphan.builder.location != (word *)0x0);
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37e,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownInt32List
            ((Orphan<capnp::List<int,_(capnp::Kind)0>_> *)&orphan,&root);
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &orphan;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,899,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            ((Reader *)&_kjCondition,&orphan.builder);
  _kjCondition_4.left = 0;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  _kjCondition_4.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.result) {
    local_204 = 0;
    OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
              ((Reader *)&_kjCondition,&orphan.builder);
    local_1cc = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x385,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", _kjCondition, 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",&_kjCondition_4
               ,&local_204,&local_1cc);
  }
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x386,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            ((Builder *)&_kjCondition,&orphan.builder);
  _kjCondition_4.left = 0;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  _kjCondition_4.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.result) {
    local_204 = 0;
    OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&_kjCondition,&orphan.builder);
    local_1cc = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", _kjCondition, 0, orphan.get().size()"
               ,(char (*) [46])"failed: expected (0) == (orphan.get().size())",&_kjCondition_4,
               &local_204,&local_1cc);
  }
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x389,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructList
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &orphan,&root);
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &orphan;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x38e,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::applyReader((Reader *)&_kjCondition,&orphan.builder);
  _kjCondition_4.left = 0;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  _kjCondition_4.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.result) {
    local_204 = 0;
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::applyReader((Reader *)&_kjCondition,&orphan.builder);
    local_1cc = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x390,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", _kjCondition, 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",&_kjCondition_4
               ,&local_204,&local_1cc);
  }
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x391,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&_kjCondition,&orphan.builder);
  _kjCondition_4.left = 0;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  _kjCondition_4.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.result) {
    local_204 = 0;
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply((Builder *)&_kjCondition,&orphan.builder);
    local_1cc = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x393,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", _kjCondition, 0, orphan.get().size()"
               ,(char (*) [46])"failed: expected (0) == (orphan.get().size())",&_kjCondition_4,
               &local_204,&local_1cc);
  }
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x394,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, DisownNull) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphan<TestAllTypes> orphan = root.disownStructField();
    EXPECT_TRUE(orphan == nullptr);

    checkTestMessageAllZero(orphan.getReader());
    EXPECT_TRUE(orphan == nullptr);

    // get()ing the orphan allocates an object, for security reasons.
    checkTestMessageAllZero(orphan.get());
    EXPECT_FALSE(orphan == nullptr);
  }

  {
    Orphan<List<int32_t>> orphan = root.disownInt32List();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }

  {
    Orphan<List<TestAllTypes>> orphan = root.disownStructList();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }
}